

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readline.c
# Opt level: O2

uchar rl_bind_wrapper(EditLine *el,uchar c)

{
  uchar uVar1;
  undefined7 in_register_00000031;
  ulong uVar2;
  
  uVar2 = CONCAT71(in_register_00000031,c) & 0xffffffff;
  if (map[uVar2] == (rl_command_func_t *)0x0) {
    uVar1 = '\x06';
  }
  else {
    _rl_update_pos();
    (*map[uVar2])(L'\x01',(wchar_t)c);
    uVar1 = (rl_done != L'\0') * '\x02';
  }
  return uVar1;
}

Assistant:

static unsigned char
rl_bind_wrapper(EditLine *el __attribute__((__unused__)), unsigned char c)
{
	if (map[c] == NULL)
		return CC_ERROR;

	_rl_update_pos();

	(*map[c])(1, c);

	/* If rl_done was set by the above call, deal with it here */
	if (rl_done)
		return CC_EOF;

	return CC_NORM;
}